

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O2

void __thiscall
QEvdevTabletHandler::QEvdevTabletHandler
          (QEvdevTabletHandler *this,QString *device,QString *spec,QObject *parent)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  int *piVar4;
  QEvdevTabletData *pQVar5;
  QSocketNotifier *this_00;
  char *__file;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  Object local_50 [8];
  QArrayDataPointer<char> local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_0010f600;
  this->m_fd = -1;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->m_device).d,&device->d);
  this->m_notifier = (QSocketNotifier *)0x0;
  this->d = (QEvdevTabletData *)0x0;
  QVar6.m_size = (size_t)"Evdev Tablet Handler";
  QVar6.field_0.m_data = this;
  QObject::setObjectName(QVar6);
  QtPrivateLogging::qLcEvdevTablet();
  if (((byte)QtPrivateLogging::qLcEvdevTablet::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_48.d._0_4_ = 2;
    local_48.d._4_4_ = 0;
    local_48.ptr._0_4_ = 0;
    local_48.ptr._4_4_ = 0;
    local_48.size._0_4_ = 0;
    local_48.size._4_4_ = 0;
    local_30 = QtPrivateLogging::qLcEvdevTablet::category.name;
    uVar3 = QString::utf16();
    QMessageLogger::debug((char *)&local_48,"evdevtablet: using %ls",uVar3);
  }
  QString::toLocal8Bit((QByteArray *)&local_48,device);
  __file = (char *)CONCAT44(local_48.ptr._4_4_,local_48.ptr._0_4_);
  if (__file == (char *)0x0) {
    __file = (char *)&QByteArray::_empty;
  }
  do {
    iVar2 = open64(__file,0x80800,0);
    if (iVar2 != -1) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  this->m_fd = iVar2;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  if (this->m_fd < 0) {
    uVar3 = QString::utf16();
    qErrnoWarning("evdevtablet: Cannot open input device %ls",uVar3);
  }
  else {
    iVar2 = ioctl(this->m_fd,0x40044590,1);
    if (iVar2 == 0) {
      ioctl(this->m_fd,0x40044590,0);
    }
    else {
      local_48.d._0_4_ = 2;
      local_48.size._4_4_ = 0;
      local_48.d._4_4_ = 0;
      local_48.ptr._0_4_ = 0;
      local_48.ptr._4_4_ = 0;
      local_48.size._0_4_ = 0;
      local_30 = "default";
      uVar3 = QString::utf16();
      QMessageLogger::warning
                ((char *)&local_48,
                 "evdevtablet: %ls: The device is grabbed by another process. No events will be read."
                 ,uVar3);
    }
    pQVar5 = (QEvdevTabletData *)operator_new(0x78);
    pQVar5->q = this;
    pQVar5->lastEventType = 0;
    (pQVar5->devName).d.d = (Data *)0x0;
    (pQVar5->devName).d.ptr = (char16_t *)0x0;
    (pQVar5->devName).d.size = 0;
    (pQVar5->minValues).x = 0;
    (pQVar5->minValues).y = 0;
    (pQVar5->minValues).p = 0;
    (pQVar5->minValues).d = 0;
    (pQVar5->maxValues).x = 0;
    (pQVar5->maxValues).y = 0;
    (pQVar5->maxValues).p = 0;
    (pQVar5->maxValues).d = 0;
    (pQVar5->state).x = 0;
    (pQVar5->state).y = 0;
    (pQVar5->state).p = 0;
    (pQVar5->state).d = 0;
    (pQVar5->state).down = false;
    (pQVar5->state).lastReportDown = false;
    *(undefined2 *)&(pQVar5->state).field_0x12 = 0;
    (pQVar5->state).tool = 0;
    *(undefined8 *)&(pQVar5->state).lastReportTool = 0;
    (pQVar5->state).lastReportPos.xp = 0.0;
    (pQVar5->state).lastReportPos.yp = 0.0;
    this->d = pQVar5;
    bVar1 = queryLimits(this);
    if (!bVar1) {
      local_48.d._0_4_ = 2;
      local_48.size._4_4_ = 0;
      local_48.d._4_4_ = 0;
      local_48.ptr._0_4_ = 0;
      local_48.ptr._4_4_ = 0;
      local_48.size._0_4_ = 0;
      local_30 = "default";
      uVar3 = QString::utf16();
      QMessageLogger::warning
                ((char *)&local_48,
                 "evdevtablet: %ls: Unset or invalid ABS limits. Behavior will be unspecified.",
                 uVar3);
    }
    this_00 = (QSocketNotifier *)operator_new(0x10);
    QSocketNotifier::QSocketNotifier(this_00,(long)this->m_fd,Read,&this->super_QObject);
    this->m_notifier = this_00;
    local_48.d._0_4_ = 0x1086ba;
    local_48.d._4_4_ = 0;
    local_48.ptr._0_4_ = 0;
    local_48.ptr._4_4_ = 0;
    QObject::
    connect<void(QSocketNotifier::*)(QSocketDescriptor,QSocketNotifier::Type,QSocketNotifier::QPrivateSignal),void(QEvdevTabletHandler::*)()>
              (local_50,(offset_in_QSocketNotifier_to_subr)this_00,
               (ContextType *)QSocketNotifier::activated,
               (offset_in_QEvdevTabletHandler_to_subr *)0x0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEvdevTabletHandler::QEvdevTabletHandler(const QString &device, const QString &spec, QObject *parent)
    : QObject(parent), m_fd(-1), m_device(device), m_notifier(0), d(0)
{
    Q_UNUSED(spec);

    setObjectName("Evdev Tablet Handler"_L1);

    qCDebug(qLcEvdevTablet, "evdevtablet: using %ls", qUtf16Printable(device));

    m_fd = QT_OPEN(device.toLocal8Bit().constData(), O_RDONLY | O_NDELAY, 0);
    if (m_fd < 0) {
        qErrnoWarning("evdevtablet: Cannot open input device %ls", qUtf16Printable(device));
        return;
    }

    bool grabSuccess = !ioctl(m_fd, EVIOCGRAB, (void *) 1);
    if (grabSuccess)
        ioctl(m_fd, EVIOCGRAB, (void *) 0);
    else
        qWarning("evdevtablet: %ls: The device is grabbed by another process. No events will be read.", qUtf16Printable(device));

    d = new QEvdevTabletData(this);
    if (!queryLimits())
        qWarning("evdevtablet: %ls: Unset or invalid ABS limits. Behavior will be unspecified.", qUtf16Printable(device));

    m_notifier = new QSocketNotifier(m_fd, QSocketNotifier::Read, this);
    connect(m_notifier, &QSocketNotifier::activated, this, &QEvdevTabletHandler::readData);
}